

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

TokenKind slang::syntax::SyntaxFacts::getModuleEndKind(TokenKind kind)

{
  TokenKind local_a;
  TokenKind kind_local;
  
  switch(kind) {
  case InterfaceKeyword:
    local_a = EndInterfaceKeyword;
    break;
  default:
    local_a = Unknown;
    break;
  case MacromoduleKeyword:
    local_a = EndModuleKeyword;
    break;
  case ModuleKeyword:
    local_a = EndModuleKeyword;
    break;
  case PackageKeyword:
    local_a = EndPackageKeyword;
    break;
  case ProgramKeyword:
    local_a = EndProgramKeyword;
  }
  return local_a;
}

Assistant:

parsing::TokenKind SyntaxFacts::getModuleEndKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return TokenKind::EndModuleKeyword;
        case TokenKind::MacromoduleKeyword: return TokenKind::EndModuleKeyword;
        case TokenKind::ProgramKeyword: return TokenKind::EndProgramKeyword;
        case TokenKind::InterfaceKeyword: return TokenKind::EndInterfaceKeyword;
        case TokenKind::PackageKeyword: return TokenKind::EndPackageKeyword;
        default: return TokenKind::Unknown;
    }
}